

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1b_password.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  iterator iVar2;
  int j;
  ulong uVar3;
  int i_1;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  string tmp;
  size_t k;
  size_t m;
  size_t n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hashed_password;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1051a8) = 0;
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&v,k,(allocator_type *)&hashed_password);
  for (uVar5 = 0; uVar5 < k; uVar5 = uVar5 + 1) {
    std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
  }
  hashed_password._M_h._M_buckets = &hashed_password._M_h._M_single_bucket;
  hashed_password._M_h._M_bucket_count = 1;
  hashed_password._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  hashed_password._M_h._M_element_count = 0;
  hashed_password._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  hashed_password._M_h._M_rehash_policy._M_next_resize = 0;
  hashed_password._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (uVar5 = 0; uVar5 < n; uVar5 = uVar5 + 1) {
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    std::operator>>((istream *)&std::cin,(string *)&tmp);
    std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&hashed_password,&tmp);
    std::__cxx11::string::~string((string *)&tmp);
  }
  for (uVar5 = 0; uVar5 < m; uVar5 = uVar5 + 1) {
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    std::operator>>((istream *)&std::cin,(string *)&tmp);
    for (uVar3 = 0; uVar3 < k; uVar3 = uVar3 + 1) {
      tmp._M_dataplus._M_p[uVar3] =
           (char)((((long)tmp._M_dataplus._M_p[uVar3] +
                   v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3]) - 0x61) % 0x1a) + 'a';
    }
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&hashed_password._M_h,&tmp);
    pcVar4 = "Match\n";
    if (iVar2.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar4 = "Unknown\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar4);
    std::__cxx11::string::~string((string *)&tmp);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&hashed_password._M_h);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return 0;
}

Assistant:

int main() {
    std::ios::sync_with_stdio(false);
    std::cin.tie(nullptr);
    size_t n, m, k;
    cin >> n >> m >> k;
    vector<size_t> v(k);
    for (size_t i = 0; i < k; ++i) {
        cin >> v[i];
    }
    unordered_set<string> hashed_password;
    for (size_t i = 0; i < n; ++i) {
        string tmp;
        cin >> tmp;
        hashed_password.insert(tmp);
    }
    for (int i = 0; i < m; ++i) {
        string tmp;
        cin >> tmp;
        for (int j = 0; j < k; ++j) {
            tmp[j] = (tmp[j] + v[j] - 'a') % 26 + 'a';
        }
        cout << ((hashed_password.find(tmp) != hashed_password.end())
                     ? "Match\n"
                     : "Unknown\n");
    }
}